

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteActions::SetNrActions(MADPComponentDiscreteActions *this,Index AI,size_t nrA)

{
  size_type sVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ulong in_RDX;
  uint in_ESI;
  long in_RDI;
  stringstream ss_1;
  Index i;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> thisAgentsActions;
  stringstream ss;
  value_type *in_stack_fffffffffffffba8;
  E *in_stack_fffffffffffffbb0;
  ActionDiscrete *this_00;
  undefined4 in_stack_fffffffffffffbb8;
  uint in_stack_fffffffffffffbbc;
  string *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  ActionDiscrete *in_stack_fffffffffffffbd0;
  allocator<char> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  undefined1 local_3f1 [33];
  string local_3d0 [120];
  stringstream local_358 [16];
  ostream local_348 [380];
  uint local_1cc;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  ulong local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (sVar1 != local_c) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"MADPComponentDiscreteActions::SetNrAction(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,") - error, actions of agents should be specified in order!");
    poVar2 = std::operator<<(poVar2," (the vector _m_nrActions should contain entries for all ");
    std::operator<<(poVar2,"preceeding agents.)");
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffbb0,(stringstream *)in_stack_fffffffffffffba8);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbc0,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::vector
            ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)0xaccce2);
  for (local_1cc = 0; local_1cc < local_18; local_1cc = local_1cc + 1) {
    std::__cxx11::stringstream::stringstream(local_358);
    in_stack_fffffffffffffbc0 = (string *)std::operator<<(local_348,"a");
    std::ostream::operator<<(in_stack_fffffffffffffbc0,local_1cc);
    in_stack_fffffffffffffbbc = local_1cc;
    std::__cxx11::stringstream::str();
    this_00 = (ActionDiscrete *)local_3f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    ActionDiscrete::ActionDiscrete
              (in_stack_fffffffffffffbd0,(Index)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               in_stack_fffffffffffffbc0,
               (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::push_back
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)this_00,
               in_stack_fffffffffffffba8);
    ActionDiscrete::~ActionDiscrete(this_00);
    std::__cxx11::string::~string((string *)(local_3f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3f1);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::stringstream::~stringstream(local_358);
  }
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::push_back((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
               *)in_stack_fffffffffffffbc0,
              (value_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::~vector
            ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)in_stack_fffffffffffffbc0);
  return;
}

Assistant:

void MADPComponentDiscreteActions::SetNrActions(Index AI, size_t nrA)
{
    if(_m_nrActions.size() != AI)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteActions::SetNrAction("<<AI<<","<<
            nrA<<
            ") - error, actions of agents should be specified in order!"<<
            " (the vector _m_nrActions should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    else
    {
        _m_nrActions.push_back(nrA);
        //create nameless actions for this agent...    
        vector<ActionDiscrete> thisAgentsActions;
        for(Index i=0;i<nrA;i++)
        {
            stringstream ss;
            ss //<< "ag"<<AI
                <<"a"<<i;
            thisAgentsActions.push_back(ActionDiscrete(i, ss.str() ));
        }
        _m_actionVecs.push_back(thisAgentsActions);
    }
}